

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O1

int llex(LexState *ls,SemInfo *seminfo)

{
  size_t *psVar1;
  byte bVar2;
  ZIO *pZVar3;
  size_t __n;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  TString *pTVar10;
  ulong uVar11;
  size_t sVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  char local_38 [8];
  
  ls->buff->n = 0;
LAB_00147557:
  uVar5 = ls->current;
  switch(uVar5) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x3b:
  case 0x3f:
    goto switchD_0014756e_caseD_0;
  case 9:
  case 0xb:
  case 0xc:
  case 0x20:
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    goto LAB_00147557;
  case 10:
  case 0xd:
    inclinenumber(ls);
    goto LAB_00147557;
  case 0x22:
  case 0x27:
    save(ls,uVar5);
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    goto joined_r0x00147815;
  case 0x2d:
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    if (uVar5 != 0x2d) {
      return 0x2d;
    }
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    if (uVar5 == 0x5b) {
      sVar12 = skip_sep(ls);
      ls->buff->n = 0;
      if (sVar12 < 2) goto LAB_0014764a;
      read_long_string(ls,(SemInfo *)0x0,sVar12);
      ls->buff->n = 0;
    }
    else {
LAB_0014764a:
      while ((uVar5 = ls->current + 1, 0xe < uVar5 || ((0x4801U >> (uVar5 & 0x1f) & 1) == 0))) {
        pZVar3 = ls->z;
        sVar12 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar12 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
      }
    }
    goto LAB_00147557;
  case 0x2e:
    save(ls,0x2e);
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar9 = check_next1(ls,0x2e);
    if (iVar9 != 0) {
      iVar9 = check_next1(ls,0x2e);
      return 0x11a - (uint)(iVar9 == 0);
    }
    if ((""[(long)ls->current + 1] & 2) == 0) {
      return 0x2e;
    }
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    iVar9 = read_numeral(ls,seminfo);
    return iVar9;
  case 0x2f:
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar8 = 0x2f;
    iVar9 = check_next1(ls,0x2f);
    bVar16 = iVar9 == 0;
    iVar9 = 0x118;
    break;
  case 0x3a:
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar8 = 0x3a;
    iVar9 = check_next1(ls,0x3a);
    bVar16 = iVar9 == 0;
    iVar9 = 0x121;
    break;
  case 0x3c:
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar9 = check_next1(ls,0x3d);
    if (iVar9 != 0) {
      return 0x11d;
    }
    iVar8 = 0x3c;
    iVar9 = check_next1(ls,0x3c);
    bVar16 = iVar9 == 0;
    iVar9 = 0x11f;
    break;
  case 0x3d:
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar8 = 0x3d;
    iVar9 = check_next1(ls,0x3d);
    bVar16 = iVar9 == 0;
    iVar9 = 0x11b;
    break;
  case 0x3e:
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar9 = check_next1(ls,0x3d);
    if (iVar9 != 0) {
      return 0x11c;
    }
    iVar8 = 0x3e;
    iVar9 = check_next1(ls,0x3e);
    bVar16 = iVar9 == 0;
    iVar9 = 0x120;
    break;
  case 0x40:
    save(ls,0x40);
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    while ((""[(long)(int)uVar5 + 1] & 3) != 0) {
      save(ls,uVar5);
      pZVar3 = ls->z;
      sVar12 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar12 == 0) {
        uVar5 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar5 = (uint)*pbVar4;
      }
      ls->current = uVar5;
    }
    check_save_next1(ls,0x5b);
    check_save_next1(ls,0x5d);
    pcVar13 = ls->buff->buffer;
    __n = ls->buff->n;
    iVar9 = strncmp(pcVar13,"@integer",__n);
    if (iVar9 == 0) {
      iVar9 = 0x127;
    }
    else {
      iVar9 = strncmp(pcVar13,"@integer[]",__n);
      if (iVar9 == 0) {
        iVar9 = 0x129;
      }
      else {
        iVar9 = strncmp(pcVar13,"@number",__n);
        if (iVar9 == 0) {
          iVar9 = 0x128;
        }
        else {
          iVar9 = strncmp(pcVar13,"@number[]",__n);
          if (iVar9 == 0) {
            iVar9 = 0x12a;
          }
          else {
            iVar9 = strncmp(pcVar13,"@table",__n);
            if (iVar9 == 0) {
              iVar9 = 299;
            }
            else {
              iVar9 = strncmp(pcVar13,"@string",__n);
              if (iVar9 == 0) {
                iVar9 = 300;
              }
              else {
                iVar9 = strncmp(pcVar13,"@closure",__n);
                if (iVar9 == 0) {
                  iVar9 = 0x12d;
                }
                else {
                  pTVar10 = luaX_newstring(ls,pcVar13 + 1,__n - 1);
                  seminfo->ts = pTVar10;
                  iVar9 = 0x40;
                }
              }
            }
          }
        }
      }
    }
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - __n;
    return iVar9;
  case 0xffffffff:
    return 0x122;
  default:
    if (uVar5 != 0x5b) {
      if (uVar5 == 0x7e) {
        pZVar3 = ls->z;
        sVar12 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar12 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        iVar9 = check_next1(ls,0x3d);
        if (iVar9 != 0) {
          return 0x11e;
        }
        return 0x7e;
      }
switchD_0014756e_caseD_0:
      if ((""[(long)(int)uVar5 + 1] & 1) == 0) {
        pZVar3 = ls->z;
        sVar12 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar12 == 0) {
          uVar6 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar6 = (uint)*pbVar4;
        }
        ls->current = uVar6;
        return uVar5;
      }
      do {
        save(ls,ls->current);
        pZVar3 = ls->z;
        sVar12 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar12 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
      } while ((""[(long)(int)uVar5 + 1] & 3) != 0);
      pTVar10 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
      seminfo->ts = pTVar10;
      if (pTVar10->tt != '\x04') {
        return 0x125;
      }
      if (pTVar10->extra == 0) {
        return 0x125;
      }
      return pTVar10->extra | 0x100;
    }
    sVar12 = skip_sep(ls);
    if (1 < sVar12) {
      read_long_string(ls,seminfo,sVar12);
      return 0x126;
    }
    if (sVar12 != 0) {
      return 0x5b;
    }
    pcVar13 = "invalid long string delimiter";
    goto LAB_00148087;
  }
  if (!bVar16) {
    return iVar9;
  }
  return iVar8;
joined_r0x00147815:
  if (uVar6 == uVar5) {
    save(ls,uVar6);
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    pTVar10 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
    seminfo->ts = pTVar10;
    return 0x126;
  }
  if ((int)uVar6 < 0x5c) {
    if (uVar6 == 0xffffffff) {
      lexerror(ls,"unfinished string",0x122);
    }
    if ((uVar6 == 10) || (uVar6 == 0xd)) {
      pcVar13 = "unfinished string";
LAB_00148087:
      lexerror(ls,pcVar13,0x126);
    }
LAB_00147888:
    save(ls,uVar6);
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    goto LAB_00147ac5;
  }
  if (uVar6 != 0x5c) goto LAB_00147888;
  save(ls,0x5c);
  pZVar3 = ls->z;
  sVar12 = pZVar3->n;
  pZVar3->n = pZVar3->n - 1;
  if (sVar12 == 0) {
    uVar6 = luaZ_fill(pZVar3);
  }
  else {
    pbVar4 = (byte *)pZVar3->p;
    pZVar3->p = (char *)(pbVar4 + 1);
    uVar6 = (uint)*pbVar4;
  }
  ls->current = uVar6;
  if ((int)uVar6 < 0x62) {
    if (0x21 < (int)uVar6) {
      uVar14 = uVar6;
      if ((int)uVar6 < 0x5c) {
        if ((uVar6 != 0x22) && (uVar6 != 0x27)) goto switchD_001478f2_caseD_6f;
      }
      else if ((uVar6 != 0x5c) && (uVar14 = 7, uVar6 != 0x61)) goto switchD_001478f2_caseD_6f;
      goto LAB_00147a90;
    }
    if (uVar6 == 0xffffffff) goto LAB_00147ac5;
    if ((uVar6 != 10) && (uVar6 != 0xd)) goto switchD_001478f2_caseD_6f;
    inclinenumber(ls);
    uVar14 = 10;
    goto LAB_00147ab2;
  }
  switch(uVar6) {
  case 0x6e:
    uVar14 = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x77:
  case 0x79:
switchD_001478f2_caseD_6f:
    esccheck(ls,""[(long)(int)uVar6 + 1] & 2,"invalid escape sequence");
    uVar14 = 0;
    uVar6 = 0;
    do {
      iVar9 = ls->current;
      if ((""[(long)iVar9 + 1] & 2) == 0) goto LAB_001479cb;
      save(ls,iVar9);
      pZVar3 = ls->z;
      sVar12 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar12 == 0) {
        uVar7 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar7 = (uint)*pbVar4;
      }
      uVar14 = iVar9 + -0x30 + uVar14 * 10;
      ls->current = uVar7;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
    uVar6 = 3;
LAB_001479cb:
    esccheck(ls,(uint)((int)uVar14 < 0x100),"decimal escape too large");
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - (ulong)uVar6;
    goto LAB_00147ab2;
  case 0x72:
    uVar14 = 0xd;
    break;
  case 0x74:
    uVar14 = 9;
    break;
  case 0x75:
    save(ls,uVar6);
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    esccheck(ls,(uint)(uVar6 == 0x7b),"missing \'{\'");
    iVar9 = gethexa(ls);
    uVar11 = (ulong)iVar9;
    lVar15 = -4;
    while( true ) {
      save(ls,ls->current);
      pZVar3 = ls->z;
      sVar12 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar12 == 0) {
        uVar6 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar6 = (uint)*pbVar4;
      }
      ls->current = uVar6;
      if ((""[(long)(int)uVar6 + 1] & 0x10) == 0) break;
      esccheck(ls,(uint)(uVar11 < 0x8000000),"UTF-8 value too large");
      iVar9 = luaO_hexavalue(ls->current);
      uVar11 = uVar11 * 0x10 + (long)iVar9;
      lVar15 = lVar15 + -1;
    }
    esccheck(ls,(uint)(uVar6 == 0x7d),"missing \'}\'");
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 + lVar15;
    uVar6 = luaO_utf8esc(local_38,uVar11);
    if (0 < (int)uVar6) {
      pcVar13 = &stack0xffffffffffffffd0 + -(ulong)uVar6;
      lVar15 = (ulong)uVar6 + 1;
      do {
        save(ls,(int)*pcVar13);
        lVar15 = lVar15 + -1;
        pcVar13 = pcVar13 + 1;
      } while (1 < lVar15);
    }
    goto LAB_00147ac5;
  case 0x76:
    uVar14 = 0xb;
    break;
  case 0x78:
    iVar9 = gethexa(ls);
    iVar8 = gethexa(ls);
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - 2;
    uVar14 = iVar8 + iVar9 * 0x10;
    break;
  case 0x7a:
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - 1;
    pZVar3 = ls->z;
    sVar12 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar12 == 0) {
      uVar6 = luaZ_fill(pZVar3);
      uVar11 = (ulong)uVar6;
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar11 = (ulong)*pbVar4;
    }
    ls->current = (int)uVar11;
    bVar2 = ""[(long)(int)uVar11 + 1];
    while ((bVar2 & 8) != 0) {
      if (((int)uVar11 == 0xd) || ((int)uVar11 == 10)) {
        inclinenumber(ls);
      }
      else {
        pZVar3 = ls->z;
        sVar12 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar12 == 0) {
          uVar6 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar6 = (uint)*pbVar4;
        }
        ls->current = uVar6;
      }
      uVar11 = (ulong)ls->current;
      bVar2 = ""[uVar11 + 1];
    }
    goto LAB_00147ac5;
  default:
    if (uVar6 == 0x66) {
      uVar14 = 0xc;
    }
    else {
      if (uVar6 != 0x62) goto switchD_001478f2_caseD_6f;
      uVar14 = 8;
    }
  }
LAB_00147a90:
  pZVar3 = ls->z;
  sVar12 = pZVar3->n;
  pZVar3->n = pZVar3->n - 1;
  if (sVar12 == 0) {
    uVar6 = luaZ_fill(pZVar3);
  }
  else {
    pbVar4 = (byte *)pZVar3->p;
    pZVar3->p = (char *)(pbVar4 + 1);
    uVar6 = (uint)*pbVar4;
  }
  ls->current = uVar6;
LAB_00147ab2:
  psVar1 = &ls->buff->n;
  *psVar1 = *psVar1 - 1;
  save(ls,uVar14);
LAB_00147ac5:
  uVar6 = ls->current;
  goto joined_r0x00147815;
}

Assistant:

static int llex (LexState *ls, SemInfo *seminfo) {
  luaZ_resetbuffer(ls->buff);
  for (;;) {
    switch (ls->current) {
      case '\n': case '\r': {  /* line breaks */
        inclinenumber(ls);
        break;
      }
      case ' ': case '\f': case '\t': case '\v': {  /* spaces */
        next(ls);
        break;
      }
      case '-': {  /* '-' or '--' (comment) */
        next(ls);
        if (ls->current != '-') return '-';
        /* else is a comment */
        next(ls);
        if (ls->current == '[') {  /* long comment? */
          size_t sep = skip_sep(ls);
          luaZ_resetbuffer(ls->buff);  /* 'skip_sep' may dirty the buffer */
          if (sep >= 2) {
            read_long_string(ls, NULL, sep);  /* skip long comment */
            luaZ_resetbuffer(ls->buff);  /* previous call may dirty the buff. */
            break;
          }
        }
        /* else short comment */
        while (!currIsNewline(ls) && ls->current != EOZ)
          next(ls);  /* skip until end of line (or end of file) */
        break;
      }
      case '[': {  /* long string or simply '[' */
        size_t sep = skip_sep(ls);
        if (sep >= 2) {
          read_long_string(ls, seminfo, sep);
          return TK_STRING;
        }
        else if (sep == 0)  /* '[=...' missing second bracket? */
          lexerror(ls, "invalid long string delimiter", TK_STRING);
        return '[';
      }
      case '=': {
        next(ls);
        if (check_next1(ls, '=')) return TK_EQ;
        else return '=';
      }
      case '<': {
        next(ls);
        if (check_next1(ls, '=')) return TK_LE;
        else if (check_next1(ls, '<')) return TK_SHL;
        else return '<';
      }
      case '>': {
        next(ls);
        if (check_next1(ls, '=')) return TK_GE;
        else if (check_next1(ls, '>')) return TK_SHR;
        else return '>';
      }
      case '/': {
        next(ls);
        if (check_next1(ls, '/')) return TK_IDIV;
        else return '/';
      }
      case '~': {
        next(ls);
        if (check_next1(ls, '=')) return TK_NE;
        else return '~';
      }
      case ':': {
        next(ls);
        if (check_next1(ls, ':')) return TK_DBCOLON;
        else return ':';
      }
      case '"': case '\'': {  /* short literal strings */
        read_string(ls, ls->current, seminfo);
        return TK_STRING;
      }
      case '.': {  /* '.', '..', '...', or number */
        save_and_next(ls);
        if (check_next1(ls, '.')) {
          if (check_next1(ls, '.'))
            return TK_DOTS;   /* '...' */
          else return TK_CONCAT;   /* '..' */
        }
        else if (!lisdigit(ls->current)) return '.';
        else return read_numeral(ls, seminfo);
      }
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9': {
        return read_numeral(ls, seminfo);
      }
      case EOZ: {
        return TK_EOS;
      }
      case '@': {
        /* RAVI change: @ introduces a type assertion operator */
        save_and_next(ls);
        while (lislalnum(ls->current)) {
          save_and_next(ls);
        }
        check_save_next1(ls, '[');
        check_save_next1(ls, ']');
        return casttoken(ls, seminfo);
      }
      default: {
        if (lislalpha(ls->current)) {  /* identifier or reserved word? */
          TString *ts;
          do {
            save_and_next(ls);
          } while (lislalnum(ls->current));
          ts = luaX_newstring(ls, luaZ_buffer(ls->buff),
                                  luaZ_bufflen(ls->buff));
          seminfo->ts = ts;
          if (isreserved(ts))  /* reserved word? */
            return ts->extra - 1 + FIRST_RESERVED;
          else {
            return TK_NAME;
          }
        }
        else {  /* single-char tokens (+ - / ...) */
          int c = ls->current;
          next(ls);
          return c;
        }
      }
    }
  }
}